

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

int TIFFSetupStrips(TIFF *tif)

{
  uint64_t *puVar1;
  uint uVar2;
  uint local_28;
  uint local_24;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x400) == 0) {
    if ((((tif->tif_dir).td_fieldsset[0] & 0x20000) == 0) || ((tif->tif_dir).td_imagelength != 0)) {
      local_28 = TIFFNumberOfStrips(tif);
    }
    else {
      local_28 = (uint)(tif->tif_dir).td_samplesperpixel;
    }
    (tif->tif_dir).td_stripsperimage = local_28;
  }
  else {
    if ((((tif->tif_dir).td_fieldsset[0] & 4) == 0) || ((tif->tif_dir).td_imagelength != 0)) {
      local_24 = TIFFNumberOfTiles(tif);
    }
    else {
      local_24 = (uint)(tif->tif_dir).td_samplesperpixel;
    }
    (tif->tif_dir).td_stripsperimage = local_24;
  }
  (tif->tif_dir).td_nstrips = (tif->tif_dir).td_stripsperimage;
  uVar2 = 4;
  if ((tif->tif_flags & 0x80000) != 0) {
    uVar2 = 8;
  }
  if ((tif->tif_dir).td_nstrips < (uint)(0x80000000 / (ulong)uVar2)) {
    if ((tif->tif_dir).td_planarconfig == 2) {
      (tif->tif_dir).td_stripsperimage =
           (tif->tif_dir).td_stripsperimage / (uint)(tif->tif_dir).td_samplesperpixel;
    }
    puVar1 = (uint64_t *)
             _TIFFCheckMalloc(tif,(ulong)(tif->tif_dir).td_nstrips,8,"for \"StripOffsets\" array");
    (tif->tif_dir).td_stripoffset_p = puVar1;
    puVar1 = (uint64_t *)
             _TIFFCheckMalloc(tif,(ulong)(tif->tif_dir).td_nstrips,8,"for \"StripByteCounts\" array"
                             );
    (tif->tif_dir).td_stripbytecount_p = puVar1;
    if (((tif->tif_dir).td_stripoffset_p == (uint64_t *)0x0) ||
       ((tif->tif_dir).td_stripbytecount_p == (uint64_t *)0x0)) {
      tif_local._4_4_ = 0;
    }
    else {
      _TIFFmemset((tif->tif_dir).td_stripoffset_p,0,(ulong)(tif->tif_dir).td_nstrips << 3);
      _TIFFmemset((tif->tif_dir).td_stripbytecount_p,0,(ulong)(tif->tif_dir).td_nstrips << 3);
      (tif->tif_dir).td_fieldsset[0] = (tif->tif_dir).td_fieldsset[0] | 0x2000000;
      (tif->tif_dir).td_fieldsset[0] = (tif->tif_dir).td_fieldsset[0] | 0x1000000;
      tif_local._4_4_ = 1;
    }
  }
  else {
    TIFFErrorExtR(tif,"TIFFSetupStrips","Too large Strip/Tile Offsets/ByteCounts arrays");
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFSetupStrips(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;

    if (isTiled(tif))
        td->td_stripsperimage = isUnspecified(tif, FIELD_TILEDIMENSIONS)
                                    ? td->td_samplesperpixel
                                    : TIFFNumberOfTiles(tif);
    else
        td->td_stripsperimage = isUnspecified(tif, FIELD_ROWSPERSTRIP)
                                    ? td->td_samplesperpixel
                                    : TIFFNumberOfStrips(tif);
    td->td_nstrips = td->td_stripsperimage;
    /* TIFFWriteDirectoryTagData has a limitation to 0x80000000U bytes */
    if (td->td_nstrips >=
        0x80000000U / ((tif->tif_flags & TIFF_BIGTIFF) ? 0x8U : 0x4U))
    {
        TIFFErrorExtR(tif, "TIFFSetupStrips",
                      "Too large Strip/Tile Offsets/ByteCounts arrays");
        return 0;
    }
    if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        td->td_stripsperimage /= td->td_samplesperpixel;
    td->td_stripoffset_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripOffsets\" array");
    td->td_stripbytecount_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripByteCounts\" array");
    if (td->td_stripoffset_p == NULL || td->td_stripbytecount_p == NULL)
        return (0);
    /*
     * Place data at the end-of-file
     * (by setting offsets to zero).
     */
    _TIFFmemset(td->td_stripoffset_p, 0, td->td_nstrips * sizeof(uint64_t));
    _TIFFmemset(td->td_stripbytecount_p, 0, td->td_nstrips * sizeof(uint64_t));
    TIFFSetFieldBit(tif, FIELD_STRIPOFFSETS);
    TIFFSetFieldBit(tif, FIELD_STRIPBYTECOUNTS);
    return (1);
}